

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hpf_process_pcm_frames
                    (ma_hpf *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ma_format mVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ma_result mVar12;
  ma_uint32 mVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong in_RCX;
  void *in_RDX;
  long lVar20;
  void *in_RSI;
  ma_format *in_RDI;
  float fVar21;
  float fVar22;
  float fVar23;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  float *pFramesInF32;
  float *pFramesOutF32;
  ma_uint32 iFrame;
  ma_uint32 ihpf2;
  ma_uint32 ihpf1;
  ma_result result;
  float y;
  float x;
  float r1;
  float b;
  float a;
  ma_uint32 channels;
  ma_uint32 c;
  ma_int32 y_2;
  ma_int32 x_2;
  ma_int32 r1_2;
  ma_int32 b_1;
  ma_int32 a_1;
  ma_uint32 channels_2;
  ma_uint32 c_2;
  float y_1;
  float x_1;
  float r2;
  float r1_1;
  float a2;
  float a1;
  float b2;
  float b1;
  float b0;
  ma_uint32 channels_1;
  ma_uint32 c_1;
  ma_int32 y_3;
  ma_int32 x_3;
  ma_int32 r2_1;
  ma_int32 r1_3;
  ma_int32 a2_1;
  ma_int32 a1_1;
  ma_int32 b2_1;
  ma_int32 b1_1;
  ma_int32 b0_1;
  ma_uint32 channels_3;
  ma_uint32 c_3;
  void *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined2 uVar24;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar25;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  uint local_1a0;
  ma_format local_19c;
  ma_format local_198;
  ma_result local_170;
  uint local_144;
  uint local_10c;
  uint local_7c;
  uint local_1c;
  
  if (in_RDI == (ma_format *)0x0) {
    local_170 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI == in_RDX) {
      for (local_198 = ma_format_unknown; local_198 < in_RDI[3];
          local_198 = local_198 + ma_format_u8) {
        mVar12 = ma_hpf1_process_pcm_frames
                           ((ma_hpf1 *)(*(undefined8 *)(in_RDI + 6) + (ulong)local_198 * 0x28),
                            in_RSI,in_RSI,in_RCX);
        if (mVar12 != MA_SUCCESS) {
          return mVar12;
        }
      }
      for (local_19c = ma_format_unknown; local_19c < in_RDI[4];
          local_19c = local_19c + ma_format_u8) {
        mVar12 = ma_hpf2_process_pcm_frames
                           ((ma_hpf2 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                            ,(void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08,0x1c26fb);
        if (mVar12 != MA_SUCCESS) {
          return mVar12;
        }
      }
    }
    if (in_RSI != in_RDX) {
      if (*in_RDI == ma_format_f32) {
        local_1b0 = in_RDX;
        local_1a8 = in_RSI;
        for (local_1a0 = 0; local_1a0 < in_RCX; local_1a0 = local_1a0 + 1) {
          mVar6 = in_RDI[1];
          mVar13 = ma_get_bytes_per_sample(*in_RDI);
          memcpy(local_1a8,local_1b0,(ulong)(mVar13 * mVar6));
          for (local_198 = ma_format_unknown; local_198 < in_RDI[3];
              local_198 = local_198 + ma_format_u8) {
            lVar20 = *(undefined8 *)(in_RDI + 6) + (ulong)local_198 * 0x28;
            uVar7 = *(uint *)(lVar20 + 4);
            fVar21 = 1.0 - *(float *)(lVar20 + 8);
            for (local_144 = 0; local_144 < uVar7; local_144 = local_144 + 1) {
              fVar22 = (1.0 - fVar21) * *(float *)((long)local_1a8 + (ulong)local_144 * 4) +
                       -(fVar21 * *(float *)(*(long *)(lVar20 + 0x10) + (ulong)local_144 * 4));
              *(float *)((long)local_1a8 + (ulong)local_144 * 4) = fVar22;
              *(float *)(*(long *)(lVar20 + 0x10) + (ulong)local_144 * 4) = fVar22;
            }
          }
          for (local_19c = ma_format_unknown; local_19c < in_RDI[4];
              local_19c = local_19c + ma_format_u8) {
            lVar20 = *(undefined8 *)(in_RDI + 8) + (ulong)local_19c * 0x40;
            uVar7 = *(uint *)(lVar20 + 4);
            fVar21 = *(float *)(lVar20 + 8);
            fVar22 = *(float *)(lVar20 + 0xc);
            fVar1 = *(float *)(lVar20 + 0x10);
            fVar2 = *(float *)(lVar20 + 0x14);
            fVar3 = *(float *)(lVar20 + 0x18);
            for (local_7c = 0; local_7c < uVar7; local_7c = local_7c + 1) {
              fVar4 = *(float *)(*(long *)(lVar20 + 0x28) + (ulong)local_7c * 4);
              fVar5 = *(float *)((long)local_1a8 + (ulong)local_7c * 4);
              fVar23 = fVar21 * fVar5 + *(float *)(*(long *)(lVar20 + 0x20) + (ulong)local_7c * 4);
              *(float *)((long)local_1a8 + (ulong)local_7c * 4) = fVar23;
              *(float *)(*(long *)(lVar20 + 0x20) + (ulong)local_7c * 4) =
                   fVar22 * fVar5 + -(fVar2 * fVar23) + fVar4;
              *(float *)(*(long *)(lVar20 + 0x28) + (ulong)local_7c * 4) =
                   fVar1 * fVar5 + -(fVar3 * fVar23);
            }
          }
          local_1a8 = (void *)((long)local_1a8 + (ulong)in_RDI[1] * 4);
          local_1b0 = (void *)((long)local_1b0 + (ulong)in_RDI[1] * 4);
        }
      }
      else {
        if (*in_RDI != ma_format_s16) {
          return MA_INVALID_OPERATION;
        }
        local_1c0 = in_RDX;
        local_1b8 = in_RSI;
        for (local_1a0 = 0; local_1a0 < in_RCX; local_1a0 = local_1a0 + 1) {
          mVar6 = in_RDI[1];
          mVar13 = ma_get_bytes_per_sample(*in_RDI);
          memcpy(local_1b8,local_1c0,(ulong)(mVar13 * mVar6));
          for (local_198 = ma_format_unknown; local_198 < in_RDI[3];
              local_198 = local_198 + ma_format_u8) {
            lVar20 = *(undefined8 *)(in_RDI + 6) + (ulong)local_198 * 0x28;
            uVar7 = *(uint *)(lVar20 + 4);
            iVar14 = 0x4000 - *(int *)(lVar20 + 8);
            for (local_10c = 0; local_10c < uVar7; local_10c = local_10c + 1) {
              iVar15 = (0x4000 - iVar14) * (int)*(short *)((long)local_1b8 + (ulong)local_10c * 2) -
                       iVar14 * *(int *)(*(long *)(lVar20 + 0x10) + (ulong)local_10c * 4) >> 0xe;
              *(short *)((long)local_1b8 + (ulong)local_10c * 2) = (short)iVar15;
              *(int *)(*(long *)(lVar20 + 0x10) + (ulong)local_10c * 4) = iVar15;
            }
          }
          for (local_19c = ma_format_unknown; local_19c < in_RDI[4];
              local_19c = local_19c + ma_format_u8) {
            lVar20 = *(undefined8 *)(in_RDI + 8) + (ulong)local_19c * 0x40;
            uVar7 = *(uint *)(lVar20 + 4);
            iVar14 = *(int *)(lVar20 + 8);
            iVar15 = *(int *)(lVar20 + 0xc);
            iVar8 = *(int *)(lVar20 + 0x10);
            iVar9 = *(int *)(lVar20 + 0x14);
            iVar10 = *(int *)(lVar20 + 0x18);
            for (local_1c = 0; local_1c < uVar7; local_1c = local_1c + 1) {
              iVar11 = *(int *)(*(long *)(lVar20 + 0x28) + (ulong)local_1c * 4);
              iVar16 = (int)*(short *)((long)local_1b8 + (ulong)local_1c * 2);
              iVar17 = iVar14 * iVar16 + *(int *)(*(long *)(lVar20 + 0x20) + (ulong)local_1c * 4) >>
                       0xe;
              iVar18 = iVar9 * iVar17;
              iVar19 = iVar10 * iVar17;
              iVar25 = iVar17;
              if (0x7ffe < iVar17) {
                iVar25 = 0x7fff;
              }
              if (iVar25 < -0x8000) {
                uVar24 = 0x8000;
              }
              else {
                if (0x7ffe < iVar17) {
                  iVar17 = 0x7fff;
                }
                uVar24 = (undefined2)iVar17;
              }
              *(undefined2 *)((long)local_1b8 + (ulong)local_1c * 2) = uVar24;
              *(int *)(*(long *)(lVar20 + 0x20) + (ulong)local_1c * 4) =
                   (iVar15 * iVar16 - iVar18) + iVar11;
              *(int *)(*(long *)(lVar20 + 0x28) + (ulong)local_1c * 4) = iVar8 * iVar16 - iVar19;
            }
          }
          local_1b8 = (void *)((long)local_1b8 + (ulong)in_RDI[1] * 2);
          local_1c0 = (void *)((long)local_1c0 + (ulong)in_RDI[1] * 2);
        }
      }
    }
    local_170 = MA_SUCCESS;
  }
  return local_170;
}

Assistant:

MA_API ma_result ma_hpf_process_pcm_frames(ma_hpf* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
            result = ma_hpf1_process_pcm_frames(&pHPF->pHPF1[ihpf1], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }

        for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
            result = ma_hpf2_process_pcm_frames(&pHPF->pHPF2[ihpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pHPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_f32(&pHPF->pHPF1[ihpf1], pFramesOutF32, pFramesOutF32);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_f32(&pHPF->pHPF2[ihpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pHPF->channels;
                pFramesInF32  += pHPF->channels;
            }
        } else if (pHPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_s16(&pHPF->pHPF1[ihpf1], pFramesOutS16, pFramesOutS16);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_s16(&pHPF->pHPF2[ihpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pHPF->channels;
                pFramesInS16  += pHPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}